

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O0

void ngai_gets(char *loc_base_ptr,char *prem,int *stride_rem,char *pbuf,int *stride_loc,int *count,
              int nstrides,int proc,int field_off,int field_size,int type_size)

{
  Integer *nbhandle;
  int *in_RCX;
  char *in_RDX;
  int *in_RSI;
  int *in_RDI;
  char *in_R8;
  char *in_R9;
  Integer handle;
  Integer *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffffb0;
  char *pcVar1;
  char *pcVar2;
  int *piVar3;
  char *pcVar4;
  int *nbhandle_00;
  
  ga_init_nbhandle(in_stack_ffffffffffffff70);
  pcVar1 = in_R9;
  pcVar2 = in_R8;
  piVar3 = in_RCX;
  pcVar4 = in_RDX;
  nbhandle_00 = in_RSI;
  nbhandle = (Integer *)get_armci_nbhandle(in_stack_ffffffffffffff70);
  ngai_nbgets(in_R9,in_R8,in_RCX,in_RDX,in_RSI,in_RDI,in_stack_ffffffffffffffb0,(int)pcVar1,
              (int)pcVar2,(int)piVar3,(int)pcVar4,nbhandle_00);
  nga_wait_internal(nbhandle);
  return;
}

Assistant:

static void ngai_gets(char *loc_base_ptr, char *prem,int *stride_rem, char *pbuf, int *stride_loc,
		      int *count, int nstrides, int proc, int field_off, 
		      int field_size, int type_size) {
#if 1
  Integer handle;
  ga_init_nbhandle(&handle);
  ngai_nbgets(loc_base_ptr, prem, stride_rem, pbuf, stride_loc, count, nstrides, proc, 
	      field_off, field_size, type_size, (armci_hdl_t*)get_armci_nbhandle(&handle));
  nga_wait_internal(&handle);
#else
  if(field_size<0 || field_size == type_size) {
    ARMCI_GetS(prem,stride_rem,pbuf,stride_loc,count,nstrides,proc);
  } else {
    int i;
    count -= 1;
    stride_loc -= 1;
    stride_rem -= 1;

    pbuf = loc_base_ptr + (pbuf - loc_base_ptr)/type_size*field_size;
    prem += field_off;

    count[1] /= type_size; 
    nstrides += 1;

    for(i=1; i<nstrides; i++) {
      stride_loc[i] /= type_size;
      stride_loc[i] *= field_size;
    }
    ARMCI_GetS(prem,stride_rem,pbuf,stride_loc,count,nstrides,proc);
    count[1] *= type_size; /*restore*/
    for(i=1; i<nstrides; i++) {
      stride_loc[i] /= field_size;
      stride_loc[i] *= type_size;
    }
  }
#endif
}